

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaft.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::Shaft::Decode(Shaft *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    KDataStream::Read<short>(stream,&this->m_i16CurrentRPM);
    KDataStream::Read<short>(stream,&this->m_i16OrderedRPM);
    KDataStream::Read<int>(stream,&this->m_i32RPMRateOfChange);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Shaft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SHAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_i16CurrentRPM
           >> m_i16OrderedRPM
           >> m_i32RPMRateOfChange;
}